

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::CopyADirectory(string *source,string *destination,bool always)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *pcVar4;
  undefined1 local_90 [8];
  string fullDestPath;
  string fullPath;
  unsigned_long local_48;
  size_t fileNum;
  Directory local_30;
  Directory dir;
  bool always_local;
  string *destination_local;
  string *source_local;
  
  dir.Internal._7_1_ = always;
  Directory::Directory(&local_30);
  Directory::Load(&local_30,source);
  bVar1 = MakeDirectory(destination);
  if (bVar1) {
    for (local_48 = 0; uVar3 = Directory::GetNumberOfFiles(&local_30), local_48 < uVar3;
        local_48 = local_48 + 1) {
      pcVar4 = Directory::GetFile(&local_30,local_48);
      iVar2 = strcmp(pcVar4,".");
      if (iVar2 != 0) {
        pcVar4 = Directory::GetFile(&local_30,local_48);
        iVar2 = strcmp(pcVar4,"..");
        if (iVar2 != 0) {
          std::__cxx11::string::string
                    ((string *)(fullDestPath.field_2._M_local_buf + 8),(string *)source);
          std::__cxx11::string::operator+=((string *)(fullDestPath.field_2._M_local_buf + 8),"/");
          pcVar4 = Directory::GetFile(&local_30,local_48);
          std::__cxx11::string::operator+=((string *)(fullDestPath.field_2._M_local_buf + 8),pcVar4)
          ;
          bVar1 = FileIsDirectory((string *)((long)&fullDestPath.field_2 + 8));
          if (bVar1) {
            std::__cxx11::string::string((string *)local_90,(string *)destination);
            std::__cxx11::string::operator+=((string *)local_90,"/");
            pcVar4 = Directory::GetFile(&local_30,local_48);
            std::__cxx11::string::operator+=((string *)local_90,pcVar4);
            bVar1 = CopyADirectory((string *)((long)&fullDestPath.field_2 + 8),(string *)local_90,
                                   (bool)(dir.Internal._7_1_ & 1));
            if (!bVar1) {
              source_local._7_1_ = 0;
            }
            bVar1 = !bVar1;
            std::__cxx11::string::~string((string *)local_90);
            if (!bVar1) goto LAB_0011b49d;
          }
          else {
            bVar1 = CopyAFile((string *)((long)&fullDestPath.field_2 + 8),destination,
                              (bool)(dir.Internal._7_1_ & 1));
            if (bVar1) {
LAB_0011b49d:
              bVar1 = false;
            }
            else {
              source_local._7_1_ = 0;
              bVar1 = true;
            }
          }
          std::__cxx11::string::~string((string *)(fullDestPath.field_2._M_local_buf + 8));
          if (bVar1) goto LAB_0011b4e1;
        }
      }
    }
    source_local._7_1_ = 1;
  }
  else {
    source_local._7_1_ = 0;
  }
LAB_0011b4e1:
  Directory::~Directory(&local_30);
  return (bool)(source_local._7_1_ & 1);
}

Assistant:

bool SystemTools::CopyADirectory(const kwsys_stl::string& source, const kwsys_stl::string& destination,
                                 bool always)
{
  Directory dir;
#ifdef _WIN32
  dir.Load(Encoding::ToNarrow(
             SystemTools::ConvertToWindowsExtendedPath(source)));
#else
  dir.Load(source);
#endif
  size_t fileNum;
  if ( !SystemTools::MakeDirectory(destination) )
    {
    return false;
    }
  for (fileNum = 0; fileNum <  dir.GetNumberOfFiles(); ++fileNum)
    {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".."))
      {
      kwsys_stl::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if(SystemTools::FileIsDirectory(fullPath))
        {
        kwsys_stl::string fullDestPath = destination;
        fullDestPath += "/";
        fullDestPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        if (!SystemTools::CopyADirectory(fullPath,
                                         fullDestPath,
                                         always))
          {
          return false;
          }
        }
      else
        {
        if(!SystemTools::CopyAFile(fullPath, destination, always))
          {
          return false;
          }
        }
      }
    }

  return true;
}